

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_proxy_module.c
# Opt level: O1

void ngx_stream_proxy_process(ngx_stream_session_t *s,ngx_uint_t from_upstream,ngx_uint_t do_write)

{
  undefined1 *puVar1;
  uint uVar2;
  ngx_connection_t *pnVar3;
  ngx_stream_upstream_t *pnVar4;
  void *pvVar5;
  ulong uVar6;
  ngx_stream_upstream_state_t *pnVar7;
  u_char *puVar8;
  ngx_buf_t *pnVar9;
  ngx_log_t *pnVar10;
  ngx_log_handler_pt p_Var11;
  ngx_event_t *pnVar12;
  bool bVar13;
  ngx_chain_t **ppnVar14;
  ulong *puVar15;
  ngx_int_t nVar16;
  ssize_t sVar17;
  ngx_chain_t **ppnVar18;
  ngx_chain_t *pnVar19;
  long lVar20;
  ngx_chain_t **busy;
  size_t sVar21;
  ngx_connection_t *pnVar22;
  ngx_connection_t *pnVar23;
  ngx_uint_t nVar24;
  size_t sVar25;
  long lVar26;
  ngx_chain_t **out;
  char *pcVar27;
  char *pcVar28;
  ngx_buf_t *pnVar29;
  ngx_connection_t *pnVar30;
  off_t oVar31;
  off_t *local_68;
  
  pnVar3 = s->connection;
  pnVar4 = s->upstream;
  if ((pnVar4->field_0x178 & 1) == 0) {
    pnVar22 = (ngx_connection_t *)0x0;
  }
  else {
    pnVar22 = (pnVar4->peer).connection;
  }
  if ((pnVar3->type != 2) || ((ngx_terminate == 0 && (ngx_exiting == 0)))) {
    pvVar5 = s->srv_conf[ngx_stream_proxy_module.ctx_index];
    if (from_upstream == 0) {
      pnVar29 = &pnVar4->downstream_buf;
      puVar15 = (ulong *)((long)pvVar5 + 0x20);
      local_68 = &s->received;
      lVar20 = 0x120;
      lVar26 = 0x118;
      pnVar23 = pnVar22;
      pnVar30 = pnVar3;
    }
    else {
      pnVar29 = &pnVar4->upstream_buf;
      puVar15 = (ulong *)((long)pvVar5 + 0x28);
      local_68 = &pnVar4->received;
      lVar20 = 0x130;
      lVar26 = 0x128;
      pnVar23 = pnVar3;
      pnVar30 = pnVar22;
    }
    out = (ngx_chain_t **)((long)&(pnVar4->peer).connection + lVar26);
    busy = (ngx_chain_t **)((long)&(pnVar4->peer).connection + lVar20);
    uVar6 = *puVar15;
    bVar13 = do_write != 0 && pnVar23 != (ngx_connection_t *)0x0;
    do {
      if ((bVar13) &&
         (((*out != (ngx_chain_t *)0x0 || (*busy != (ngx_chain_t *)0x0)) ||
          (pnVar23->field_0xd8 != '\0')))) {
        nVar16 = (*ngx_stream_top_filter)(s,*out,from_upstream);
        if (nVar16 == -1) {
          if ((from_upstream == 0) && (pnVar3->type == 2)) goto LAB_0018fa74;
          nVar24 = 200;
          goto LAB_0018faca;
        }
        ngx_chain_update_chains(pnVar3->pool,&pnVar4->free,busy,out,&ngx_stream_proxy_module);
        if (*busy == (ngx_chain_t *)0x0) {
          pnVar29->pos = pnVar29->start;
          pnVar29->last = pnVar29->start;
        }
      }
      sVar21 = (long)pnVar29->end - (long)pnVar29->last;
      if (sVar21 == 0) {
LAB_0018f8cc:
        uVar2 = *(uint *)&pnVar30->read->field_0x8;
        if ((((uVar2 >> 8 & 1) == 0) || (pnVar23 == (ngx_connection_t *)0x0)) ||
           (((pnVar23->read->field_0x9 & 1) == 0 && (pnVar23->field_0xd8 != '\0')))) {
          if (((pnVar30->field_0xda & 2) != 0) ||
             (nVar16 = ngx_handle_read_event(pnVar30->read,(ulong)(uVar2 >> 8 & 1)), nVar16 == 0)) {
            if (pnVar23 == (ngx_connection_t *)0x0) {
              return;
            }
            if (((pnVar23->field_0xda & 2) != 0) ||
               (nVar16 = ngx_handle_write_event(pnVar23->write,0), nVar16 == 0)) {
              if (((pnVar3->read->field_0x9 & 0x10) == 0) &&
                 ((pnVar22->read->field_0x9 & 0x10) == 0)) {
                ngx_event_add_timer(pnVar3->write,*(ngx_msec_t *)((long)pvVar5 + 8));
                return;
              }
              pnVar12 = pnVar3->write;
              if ((pnVar12->field_0x9 & 8) == 0) {
                return;
              }
              if ((pnVar12->log->log_level & 0x80) != 0) {
                ngx_log_error_core(8,pnVar12->log,0,"event timer del: %d: %M",
                                   (ulong)*(uint *)((long)pnVar12->data + 0x18),(pnVar12->timer).key
                                  );
              }
              ngx_rbtree_delete(&ngx_event_timer_rbtree,&pnVar12->timer);
              (pnVar12->timer).left = (ngx_rbtree_node_t *)0x0;
              (pnVar12->timer).right = (ngx_rbtree_node_t *)0x0;
              (pnVar12->timer).parent = (ngx_rbtree_node_t *)0x0;
              pnVar12->field_0x9 = pnVar12->field_0x9 & 0xf7;
              return;
            }
          }
          nVar24 = 500;
        }
        else {
          pnVar10 = pnVar3->log;
          p_Var11 = pnVar10->handler;
          pnVar10->handler = (ngx_log_handler_pt)0x0;
          if (6 < pnVar10->log_level) {
            pcVar27 = "";
            if (pnVar30->type == 2) {
              pcVar27 = "udp ";
            }
            pcVar28 = "client";
            if (from_upstream != 0) {
              pcVar28 = "upstream";
            }
            if (pnVar22 == (ngx_connection_t *)0x0) {
              oVar31 = 0;
            }
            else {
              oVar31 = pnVar22->sent;
            }
            ngx_log_error_core(7,pnVar10,0,
                               "%s%s disconnected, bytes from/to client:%O/%O, bytes from/to upstream:%O/%O"
                               ,pcVar27,pcVar28,s->received,pnVar3->sent,pnVar4->received,oVar31);
          }
          pnVar3->log->handler = p_Var11;
          nVar24 = 200;
        }
        goto LAB_0018faca;
      }
      uVar2 = *(uint *)&pnVar30->read->field_0x8;
      if ((uVar2 & 0x1220) != 0x20) goto LAB_0018f8cc;
      if (uVar6 != 0) {
        lVar20 = ((ngx_cached_time->sec - pnVar4->start_sec) + 1) * uVar6;
        sVar25 = lVar20 - *local_68;
        if (sVar25 == 0 || lVar20 < *local_68) {
          *(uint *)&pnVar30->read->field_0x8 = uVar2 | 0x1000;
          ngx_event_add_timer(pnVar30->read,(sVar25 * -1000) / uVar6 + 1);
          goto LAB_0018f8cc;
        }
        if ((long)sVar25 <= (long)sVar21) {
          sVar21 = sVar25;
        }
      }
      sVar17 = (*pnVar30->recv)(pnVar30,pnVar29->last,sVar21);
      if (sVar17 == -1) {
        if ((pnVar3->type == 2) && (pnVar4->received == 0)) {
LAB_0018fa74:
          ngx_stream_proxy_next_upstream(s);
          return;
        }
        puVar1 = &pnVar30->read->field_0x8;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x100;
        sVar17 = 0;
      }
      else if (sVar17 == -2) goto LAB_0018f8cc;
      if (sVar17 < 0) goto LAB_0018f8cc;
      if ((uVar6 != 0) && (uVar6 <= (ulong)(sVar17 * 1000))) {
        puVar1 = &pnVar30->read->field_0x8;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x1000;
        ngx_event_add_timer(pnVar30->read,(ulong)(sVar17 * 1000) / uVar6);
      }
      if ((from_upstream != 0) &&
         (pnVar7 = pnVar4->state, pnVar7->first_byte_time == 0xffffffffffffffff)) {
        pnVar7->first_byte_time = ngx_current_msec - pnVar7->response_time;
      }
      ppnVar14 = out;
      if ((pnVar3->type == 2) &&
         (nVar24 = pnVar4->responses + 1, pnVar4->responses = nVar24,
         nVar24 == *(ngx_uint_t *)((long)pvVar5 + 0x30))) {
        puVar1 = &pnVar30->read->field_0x8;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffffffdf;
        puVar1 = &pnVar30->read->field_0x8;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x100;
      }
      do {
        ppnVar18 = ppnVar14;
        pnVar19 = *ppnVar18;
        ppnVar14 = &pnVar19->next;
      } while (pnVar19 != (ngx_chain_t *)0x0);
      pnVar19 = ngx_chain_get_free_buf(pnVar3->pool,&pnVar4->free);
      if (pnVar19 == (ngx_chain_t *)0x0) goto LAB_0018f8a0;
      *ppnVar18 = pnVar19;
      puVar8 = pnVar29->last;
      pnVar9 = pnVar19->buf;
      pnVar9->pos = puVar8;
      pnVar9->last = puVar8 + sVar17;
      pnVar9->tag = &ngx_stream_proxy_module;
      *(ushort *)&pnVar9->field_0x48 =
           (ushort)*(undefined4 *)&pnVar9->field_0x48 & 0xfffe | (ushort)(sVar17 != 0);
      *(ushort *)&pnVar19->buf->field_0x48 =
           (ushort)*(undefined4 *)&pnVar19->buf->field_0x48 & 0xff7f |
           *(ushort *)&pnVar30->read->field_0x8 >> 1 & 0x80;
      puVar1 = &pnVar19->buf->field_0x48;
      *(ushort *)puVar1 = *(ushort *)puVar1 | 0x20;
      *local_68 = *local_68 + sVar17;
      pnVar29->last = pnVar29->last + sVar17;
      bVar13 = pnVar23 != (ngx_connection_t *)0x0;
    } while( true );
  }
  pnVar10 = pnVar3->log;
  p_Var11 = pnVar10->handler;
  pnVar10->handler = (ngx_log_handler_pt)0x0;
  if (6 < pnVar10->log_level) {
    ngx_log_error_core(7,pnVar10,0,"disconnected on shutdown");
  }
  pnVar3->log->handler = p_Var11;
  nVar24 = 200;
LAB_0018faca:
  ngx_stream_proxy_finalize(s,nVar24);
  return;
LAB_0018f8a0:
  nVar24 = 500;
  goto LAB_0018faca;
}

Assistant:

static void
ngx_stream_proxy_process(ngx_stream_session_t *s, ngx_uint_t from_upstream,
    ngx_uint_t do_write)
{
    off_t                        *received, limit;
    size_t                        size, limit_rate;
    ssize_t                       n;
    ngx_buf_t                    *b;
    ngx_int_t                     rc;
    ngx_uint_t                    flags;
    ngx_msec_t                    delay;
    ngx_chain_t                  *cl, **ll, **out, **busy;
    ngx_connection_t             *c, *pc, *src, *dst;
    ngx_log_handler_pt            handler;
    ngx_stream_upstream_t        *u;
    ngx_stream_proxy_srv_conf_t  *pscf;

    u = s->upstream;

    c = s->connection;
    pc = u->connected ? u->peer.connection : NULL;

    if (c->type == SOCK_DGRAM && (ngx_terminate || ngx_exiting)) {

        /* socket is already closed on worker shutdown */

        handler = c->log->handler;
        c->log->handler = NULL;

        ngx_log_error(NGX_LOG_INFO, c->log, 0, "disconnected on shutdown");

        c->log->handler = handler;

        ngx_stream_proxy_finalize(s, NGX_STREAM_OK);
        return;
    }

    pscf = ngx_stream_get_module_srv_conf(s, ngx_stream_proxy_module);

    if (from_upstream) {
        src = pc;
        dst = c;
        b = &u->upstream_buf;
        limit_rate = pscf->download_rate;
        received = &u->received;
        out = &u->downstream_out;
        busy = &u->downstream_busy;

    } else {
        src = c;
        dst = pc;
        b = &u->downstream_buf;
        limit_rate = pscf->upload_rate;
        received = &s->received;
        out = &u->upstream_out;
        busy = &u->upstream_busy;
    }

    for ( ;; ) {

        if (do_write && dst) {

            if (*out || *busy || dst->buffered) {
                rc = ngx_stream_top_filter(s, *out, from_upstream);

                if (rc == NGX_ERROR) {
                    if (c->type == SOCK_DGRAM && !from_upstream) {
                        ngx_stream_proxy_next_upstream(s);
                        return;
                    }

                    ngx_stream_proxy_finalize(s, NGX_STREAM_OK);
                    return;
                }

                ngx_chain_update_chains(c->pool, &u->free, busy, out,
                                      (ngx_buf_tag_t) &ngx_stream_proxy_module);

                if (*busy == NULL) {
                    b->pos = b->start;
                    b->last = b->start;
                }
            }
        }

        size = b->end - b->last;

        if (size && src->read->ready && !src->read->delayed
            && !src->read->error)
        {
            if (limit_rate) {
                limit = (off_t) limit_rate * (ngx_time() - u->start_sec + 1)
                        - *received;

                if (limit <= 0) {
                    src->read->delayed = 1;
                    delay = (ngx_msec_t) (- limit * 1000 / limit_rate + 1);
                    ngx_add_timer(src->read, delay);
                    break;
                }

                if ((off_t) size > limit) {
                    size = (size_t) limit;
                }
            }

            n = src->recv(src, b->last, size);

            if (n == NGX_AGAIN) {
                break;
            }

            if (n == NGX_ERROR) {
                if (c->type == SOCK_DGRAM && u->received == 0) {
                    ngx_stream_proxy_next_upstream(s);
                    return;
                }

                src->read->eof = 1;
                n = 0;
            }

            if (n >= 0) {
                if (limit_rate) {
                    delay = (ngx_msec_t) (n * 1000 / limit_rate);

                    if (delay > 0) {
                        src->read->delayed = 1;
                        ngx_add_timer(src->read, delay);
                    }
                }

                if (from_upstream) {
                    if (u->state->first_byte_time == (ngx_msec_t) -1) {
                        u->state->first_byte_time = ngx_current_msec
                                                    - u->state->response_time;
                    }
                }

                if (c->type == SOCK_DGRAM && ++u->responses == pscf->responses)
                {
                    src->read->ready = 0;
                    src->read->eof = 1;
                }

                for (ll = out; *ll; ll = &(*ll)->next) { /* void */ }

                cl = ngx_chain_get_free_buf(c->pool, &u->free);
                if (cl == NULL) {
                    ngx_stream_proxy_finalize(s,
                                              NGX_STREAM_INTERNAL_SERVER_ERROR);
                    return;
                }

                *ll = cl;

                cl->buf->pos = b->last;
                cl->buf->last = b->last + n;
                cl->buf->tag = (ngx_buf_tag_t) &ngx_stream_proxy_module;

                cl->buf->temporary = (n ? 1 : 0);
                cl->buf->last_buf = src->read->eof;
                cl->buf->flush = 1;

                *received += n;
                b->last += n;
                do_write = 1;

                continue;
            }
        }

        break;
    }

    if (src->read->eof && dst && (dst->read->eof || !dst->buffered)) {
        handler = c->log->handler;
        c->log->handler = NULL;

        ngx_log_error(NGX_LOG_INFO, c->log, 0,
                      "%s%s disconnected"
                      ", bytes from/to client:%O/%O"
                      ", bytes from/to upstream:%O/%O",
                      src->type == SOCK_DGRAM ? "udp " : "",
                      from_upstream ? "upstream" : "client",
                      s->received, c->sent, u->received, pc ? pc->sent : 0);

        c->log->handler = handler;

        ngx_stream_proxy_finalize(s, NGX_STREAM_OK);
        return;
    }

    flags = src->read->eof ? NGX_CLOSE_EVENT : 0;

    if (!src->shared && ngx_handle_read_event(src->read, flags) != NGX_OK) {
        ngx_stream_proxy_finalize(s, NGX_STREAM_INTERNAL_SERVER_ERROR);
        return;
    }

    if (dst) {
        if (!dst->shared && ngx_handle_write_event(dst->write, 0) != NGX_OK) {
            ngx_stream_proxy_finalize(s, NGX_STREAM_INTERNAL_SERVER_ERROR);
            return;
        }

        if (!c->read->delayed && !pc->read->delayed) {
            ngx_add_timer(c->write, pscf->timeout);

        } else if (c->write->timer_set) {
            ngx_del_timer(c->write);
        }
    }
}